

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O1

void __thiscall
pbrt::SubsurfaceMaterial::GetBSSRDF<pbrt::UniversalTextureEvaluator>
          (SubsurfaceMaterial *this,TextureEvalContext *param_2,SampledWavelengths *param_3,
          undefined8 *param_4,size_t param_5)

{
  float fVar1;
  ulong uVar2;
  int c;
  long lVar3;
  undefined1 auVar4 [16];
  Float FVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar13 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [16];
  ulong in_XMM1_Qb;
  undefined1 auVar19 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  span<const_float> values;
  span<const_float> x;
  SampledSpectrum SVar20;
  SampledSpectrum r;
  SampledSpectrum mfree;
  UniversalTextureEvaluator local_289;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  SampledSpectrum local_278;
  SampledSpectrum local_268;
  uintptr_t local_258;
  Float local_250;
  int iStack_24c;
  int iStack_248;
  int iStack_244;
  uintptr_t local_240;
  uintptr_t local_238;
  ulong local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  ulong uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 local_168;
  ulong uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 local_128;
  ulong uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  ulong uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  TabulatedBSSRDF local_a0;
  
  local_268.values.values = (array<float,_4>)ZEXT816(0);
  local_278.values.values = (array<float,_4>)ZEXT816(0);
  uVar2 = (this->sigma_a).
          super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          .bits;
  if (((uVar2 & 0xffffffffffff) == 0) ||
     (((this->sigma_s).
       super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
       .bits & 0xffffffffffff) == 0)) {
    local_288 = this->scale;
    lVar3 = 0;
    local_240 = (this->mfp).
                super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                .bits;
    local_168._0_4_ = (param_2->p).super_Tuple3<pbrt::Point3,_float>.x;
    local_168._4_4_ = (param_2->p).super_Tuple3<pbrt::Point3,_float>.y;
    uStack_160 = *(ulong *)&(param_2->p).super_Tuple3<pbrt::Point3,_float>.z;
    uStack_158._0_4_ = (param_2->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
    uStack_158._4_4_ = (param_2->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
    uStack_150._0_4_ = (param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
    uStack_150._4_4_ = (param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
    uStack_148 = *(undefined8 *)&(param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
    uStack_140 = *(undefined8 *)&(param_2->uv).super_Tuple2<pbrt::Point2,_float>.y;
    uStack_138._0_4_ = param_2->dudy;
    uStack_138._4_4_ = param_2->dvdx;
    uStack_130._0_4_ = param_2->dvdy;
    uStack_130._4_4_ = param_2->faceIndex;
    local_208 = *(undefined8 *)(param_3->lambda).values;
    uStack_200 = *(undefined8 *)((param_3->lambda).values + 2);
    uStack_1f8 = *(undefined8 *)(param_3->pdf).values;
    uStack_1f0 = *(undefined8 *)((param_3->pdf).values + 2);
    auVar13 = ZEXT856(uStack_160);
    auVar19 = ZEXT856(in_XMM1_Qb);
    fStack_284 = local_288;
    fStack_280 = local_288;
    fStack_27c = local_288;
    SVar20 = UniversalTextureEvaluator::operator()
                       (&local_289,(SpectrumTextureHandle)&local_240,*param_2,*param_3);
    auVar17._0_8_ = SVar20.values.values._8_8_;
    auVar17._8_56_ = auVar19;
    auVar11._0_8_ = SVar20.values.values._0_8_;
    auVar11._8_56_ = auVar13;
    auVar4 = vmovlhps_avx(auVar11._0_16_,auVar17._0_16_);
    auVar8._0_4_ = auVar4._0_4_ * local_288;
    auVar8._4_4_ = auVar4._4_4_ * fStack_284;
    auVar8._8_4_ = auVar4._8_4_ * fStack_280;
    auVar8._12_4_ = auVar4._12_4_ * fStack_27c;
    local_a0._0_16_ = vmaxps_avx(auVar8,_DAT_0045e4a0);
    local_258 = (this->reflectance).
                super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                .bits;
    local_1a8._0_4_ = (param_2->p).super_Tuple3<pbrt::Point3,_float>.x;
    local_1a8._4_4_ = (param_2->p).super_Tuple3<pbrt::Point3,_float>.y;
    uStack_1a0 = *(ulong *)&(param_2->p).super_Tuple3<pbrt::Point3,_float>.z;
    uStack_198._0_4_ = (param_2->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
    uStack_198._4_4_ = (param_2->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
    uStack_190._0_4_ = (param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
    uStack_190._4_4_ = (param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
    uStack_188 = *(undefined8 *)&(param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
    uStack_180 = *(undefined8 *)&(param_2->uv).super_Tuple2<pbrt::Point2,_float>.y;
    uStack_178._0_4_ = param_2->dudy;
    uStack_178._4_4_ = param_2->dvdx;
    uStack_170._0_4_ = param_2->dvdy;
    uStack_170._4_4_ = param_2->faceIndex;
    local_228 = *(undefined8 *)(param_3->lambda).values;
    uStack_220 = *(undefined8 *)((param_3->lambda).values + 2);
    uStack_218 = *(undefined8 *)(param_3->pdf).values;
    uStack_210 = *(undefined8 *)((param_3->pdf).values + 2);
    auVar13 = ZEXT856(uStack_1a0);
    auVar19 = ZEXT856(auVar19._0_8_);
    SVar20 = UniversalTextureEvaluator::operator()
                       (&local_289,(SpectrumTextureHandle)&local_258,*param_2,*param_3);
    auVar18._0_8_ = SVar20.values.values._8_8_;
    auVar18._8_56_ = auVar19;
    auVar12._0_8_ = SVar20.values.values._0_8_;
    auVar12._8_56_ = auVar13;
    auVar4 = vmovlhps_avx(auVar12._0_16_,auVar18._0_16_);
    uVar2 = vcmpps_avx512vl(auVar4,_DAT_0045e4a0,5);
    auVar14._8_4_ = 0x3f800000;
    auVar14._0_8_ = 0x3f8000003f800000;
    auVar14._12_4_ = 0x3f800000;
    auVar4 = vminps_avx512vl(auVar14,auVar4);
    local_250 = (Float)((uint)((byte)uVar2 & 1) * auVar4._0_4_);
    iStack_24c = (uint)((byte)(uVar2 >> 1) & 1) * auVar4._4_4_;
    iStack_248 = (uint)((byte)(uVar2 >> 2) & 1) * auVar4._8_4_;
    iStack_244 = (uint)((byte)(uVar2 >> 3) & 1) * auVar4._12_4_;
    do {
      values.n = param_5;
      values.ptr = (float *)(this->table).rhoEff.nStored;
      x.n = (size_t)(this->table).rhoEff.ptr;
      x.ptr = (float *)(this->table).rhoSamples.nStored;
      FVar5 = InvertCatmullRom((pbrt *)(this->table).rhoSamples.ptr,x,values,(&local_250)[lVar3]);
      fVar1 = (&(((TabulatedBSSRDF *)(&local_a0.sigma_t + -5))->po).
                super_Tuple3<pbrt::Point3,_float>.x)[lVar3];
      local_278.values.values[lVar3] = FVar5 / fVar1;
      local_268.values.values[lVar3] = (1.0 - FVar5) / fVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
  }
  else {
    local_288 = this->scale;
    local_e8._0_4_ = (param_2->p).super_Tuple3<pbrt::Point3,_float>.x;
    local_e8._4_4_ = (param_2->p).super_Tuple3<pbrt::Point3,_float>.y;
    uStack_e0 = *(ulong *)&(param_2->p).super_Tuple3<pbrt::Point3,_float>.z;
    uStack_d8._0_4_ = (param_2->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
    uStack_d8._4_4_ = (param_2->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
    uStack_d0._0_4_ = (param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
    uStack_d0._4_4_ = (param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
    uStack_c8 = *(undefined8 *)&(param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
    uStack_c0 = *(undefined8 *)&(param_2->uv).super_Tuple2<pbrt::Point2,_float>.y;
    uStack_b8._0_4_ = param_2->dudy;
    uStack_b8._4_4_ = param_2->dvdx;
    uStack_b0._0_4_ = param_2->dvdy;
    uStack_b0._4_4_ = param_2->faceIndex;
    local_1c8 = *(undefined8 *)(param_3->lambda).values;
    uStack_1c0 = *(undefined8 *)((param_3->lambda).values + 2);
    uStack_1b8 = *(undefined8 *)(param_3->pdf).values;
    uStack_1b0 = *(undefined8 *)((param_3->pdf).values + 2);
    auVar13 = ZEXT856(uStack_e0);
    auVar19 = ZEXT856(in_XMM1_Qb);
    fStack_284 = local_288;
    fStack_280 = local_288;
    fStack_27c = local_288;
    local_230 = uVar2;
    SVar20 = UniversalTextureEvaluator::operator()
                       (&local_289,(SpectrumTextureHandle)&local_230,*param_2,*param_3);
    auVar15._0_8_ = SVar20.values.values._8_8_;
    auVar15._8_56_ = auVar19;
    auVar9._0_8_ = SVar20.values.values._0_8_;
    auVar9._8_56_ = auVar13;
    auVar4 = vmovlhps_avx(auVar9._0_16_,auVar15._0_16_);
    auVar6._0_4_ = auVar4._0_4_ * local_288;
    auVar6._4_4_ = auVar4._4_4_ * fStack_284;
    auVar6._8_4_ = auVar4._8_4_ * fStack_280;
    auVar6._12_4_ = auVar4._12_4_ * fStack_27c;
    local_268.values.values = (array<float,_4>)vmaxps_avx(auVar6,ZEXT816(0) << 0x40);
    local_288 = this->scale;
    local_238 = (this->sigma_s).
                super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                .bits;
    local_128._0_4_ = (param_2->p).super_Tuple3<pbrt::Point3,_float>.x;
    local_128._4_4_ = (param_2->p).super_Tuple3<pbrt::Point3,_float>.y;
    uStack_120 = *(ulong *)&(param_2->p).super_Tuple3<pbrt::Point3,_float>.z;
    uStack_118._0_4_ = (param_2->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
    uStack_118._4_4_ = (param_2->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
    uStack_110._0_4_ = (param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
    uStack_110._4_4_ = (param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
    uStack_108 = *(undefined8 *)&(param_2->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
    uStack_100 = *(undefined8 *)&(param_2->uv).super_Tuple2<pbrt::Point2,_float>.y;
    uStack_f8._0_4_ = param_2->dudy;
    uStack_f8._4_4_ = param_2->dvdx;
    uStack_f0._0_4_ = param_2->dvdy;
    uStack_f0._4_4_ = param_2->faceIndex;
    local_1e8 = *(undefined8 *)(param_3->lambda).values;
    uStack_1e0 = *(undefined8 *)((param_3->lambda).values + 2);
    uStack_1d8 = *(undefined8 *)(param_3->pdf).values;
    uStack_1d0 = *(undefined8 *)((param_3->pdf).values + 2);
    auVar13 = ZEXT856(uStack_120);
    auVar19 = ZEXT856(0);
    fStack_284 = local_288;
    fStack_280 = local_288;
    fStack_27c = local_288;
    SVar20 = UniversalTextureEvaluator::operator()
                       (&local_289,(SpectrumTextureHandle)&local_238,*param_2,*param_3);
    auVar16._0_8_ = SVar20.values.values._8_8_;
    auVar16._8_56_ = auVar19;
    auVar10._0_8_ = SVar20.values.values._0_8_;
    auVar10._8_56_ = auVar13;
    auVar4 = vmovlhps_avx(auVar10._0_16_,auVar16._0_16_);
    auVar7._0_4_ = auVar4._0_4_ * local_288;
    auVar7._4_4_ = auVar4._4_4_ * fStack_284;
    auVar7._8_4_ = auVar4._8_4_ * fStack_280;
    auVar7._12_4_ = auVar4._12_4_ * fStack_27c;
    local_278.values.values = (array<float,_4>)vmaxps_avx(auVar7,_DAT_0045e4a0);
  }
  TabulatedBSSRDF::TabulatedBSSRDF
            (&local_a0,&param_2->p,(Vector3f *)&param_2[1].uv,(Normal3f *)&param_2[1].dpdy,
             (Vector3f *)(param_2 + 1),0.0,this->eta,&local_268,&local_278,&this->table);
  param_4[6] = local_a0._48_8_;
  param_4[7] = local_a0.ts.super_Tuple3<pbrt::Vector3,_float>._4_8_;
  param_4[8] = local_a0._64_8_;
  param_4[9] = local_a0.table;
  param_4[10] = local_a0.sigma_t.values.values._0_8_;
  param_4[0xb] = local_a0.sigma_t.values.values._8_8_;
  param_4[0xc] = local_a0.rho.values.values._0_8_;
  param_4[0xd] = local_a0.rho.values.values._8_8_;
  *param_4 = local_a0.po.super_Tuple3<pbrt::Point3,_float>._0_8_;
  param_4[1] = local_a0._8_8_;
  param_4[2] = local_a0.wo.super_Tuple3<pbrt::Vector3,_float>._4_8_;
  param_4[3] = local_a0._24_8_;
  param_4[4] = local_a0.ns.super_Tuple3<pbrt::Normal3,_float>._4_8_;
  param_4[5] = local_a0.ss.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  param_4[6] = local_a0._48_8_;
  param_4[7] = local_a0.ts.super_Tuple3<pbrt::Vector3,_float>._4_8_;
  return;
}

Assistant:

PBRT_CPU_GPU void GetBSSRDF(TextureEvaluator texEval, const MaterialEvalContext &ctx,
                                SampledWavelengths &lambda,
                                TabulatedBSSRDF *bssrdf) const {
        SampledSpectrum sig_a, sig_s;
        if (sigma_a && sigma_s) {
            // Evaluate textures for $\sigma_\roman{a}$ and $\sigma_\roman{s}$
            sig_a = ClampZero(scale * texEval(sigma_a, ctx, lambda));
            sig_s = ClampZero(scale * texEval(sigma_s, ctx, lambda));

        } else {
            // Compute _sig_a_ and _sig_s_ from reflectance and mfp
            DCHECK(reflectance && mfp);
            SampledSpectrum mfree = ClampZero(scale * texEval(mfp, ctx, lambda));
            SampledSpectrum r = Clamp(texEval(reflectance, ctx, lambda), 0, 1);
            SubsurfaceFromDiffuse(table, r, mfree, &sig_a, &sig_s);
        }
        *bssrdf = TabulatedBSSRDF(ctx.p, ctx.dpdus, ctx.ns, ctx.wo, 0 /* FIXME: si.time*/,
                                  eta, sig_a, sig_s, &table);
    }